

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O2

int WebPWriteAlphaPlane(FILE *fout,WebPDecBuffer *buffer)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  uint8_t *__ptr;
  uint uVar4;
  bool bVar5;
  
  iVar2 = 0;
  if ((buffer != (WebPDecBuffer *)0x0 && fout != (FILE *)0x0) &&
     (__ptr = (buffer->u).YUVA.a, iVar2 = 0, __ptr != (uint8_t *)0x0)) {
    uVar4 = buffer->height;
    iVar2 = (buffer->u).YUVA.a_stride;
    uVar1 = buffer->width;
    fprintf((FILE *)fout,"P5\n%u %u\n255\n",(ulong)uVar1,(ulong)uVar4,in_R8,in_R9,0);
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      sVar3 = fwrite(__ptr,(ulong)uVar1,1,(FILE *)fout);
      if (sVar3 != 1) {
        return 0;
      }
      __ptr = __ptr + iVar2;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int WebPWriteAlphaPlane(FILE* fout, const WebPDecBuffer* const buffer) {
  if (fout == NULL || buffer == NULL) {
    return 0;
  } else {
    const uint32_t width = buffer->width;
    const uint32_t height = buffer->height;
    const uint8_t* a = buffer->u.YUVA.a;
    const int a_stride = buffer->u.YUVA.a_stride;
    uint32_t y;

    if (a == NULL) return 0;

    fprintf(fout, "P5\n%u %u\n255\n", width, height);
    for (y = 0; y < height; ++y) {
      if (fwrite(a, width, 1, fout) != 1) return 0;
      a += a_stride;
    }
    return 1;
  }
}